

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotter.hpp
# Opt level: O2

char * nivalis::PointMarker::label_repr(int lab)

{
  if (lab - 1U < 6) {
    return &DAT_001fd95c + *(int *)(&DAT_001fd95c + (ulong)(lab - 1U) * 4);
  }
  return "";
}

Assistant:

static constexpr const char* label_repr(int lab) {
        switch(lab) {
            case LABEL_X_INT: return "x-intercept\n";
            case LABEL_Y_INT: return "y-intercept\n";
            case LABEL_LOCAL_MIN: return "local minimum\n";
            case LABEL_LOCAL_MAX: return "local maximum\n";
            case LABEL_INTERSECTION: return "intersection\n";
            case LABEL_INFLECTION_PT: return "inflection point\n";
            default: return "";
        }
    }